

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

char * __thiscall
CoreML::Specification::SlidingWindowsLayerParams::_InternalParse
          (SlidingWindowsLayerParams *this,char *ptr,ParseContext *ctx)

{
  uint tag_00;
  bool bVar1;
  uint uVar2;
  uint64_t uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  uint local_24;
  ParseContext *pPStack_20;
  uint32_t tag;
  ParseContext *ctx_local;
  char *ptr_local;
  SlidingWindowsLayerParams *this_local;
  
  pPStack_20 = ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)this;
  do {
    while( true ) {
      bVar1 = google::protobuf::internal::ParseContext::Done(pPStack_20,(char **)&ctx_local);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        return (char *)ctx_local;
      }
      ctx_local = (ParseContext *)google::protobuf::internal::ReadTag((char *)ctx_local,&local_24,0)
      ;
      tag_00 = local_24;
      uVar2 = local_24 >> 3;
      if (uVar2 != 1) break;
      if ((local_24 & 0xff) != 8) goto LAB_0035b44e;
      uVar3 = google::protobuf::internal::ReadVarint64((char **)&ctx_local);
      this->axis_ = uVar3;
joined_r0x0035b4b5:
      if (ctx_local == (ParseContext *)0x0) {
        return (char *)0x0;
      }
    }
    if (uVar2 != 2) {
      if ((uVar2 == 3) && ((local_24 & 0xff) == 0x18)) {
        uVar3 = google::protobuf::internal::ReadVarint64((char **)&ctx_local);
        this->step_ = uVar3;
        goto joined_r0x0035b4b5;
      }
LAB_0035b44e:
      if ((local_24 == 0) || ((local_24 & 7) == 4)) {
        if (ctx_local == (ParseContext *)0x0) {
          return (char *)0x0;
        }
        google::protobuf::internal::EpsCopyInputStream::SetLastTag
                  (&pPStack_20->super_EpsCopyInputStream,local_24);
        return (char *)ctx_local;
      }
      unknown = google::protobuf::internal::InternalMetadata::
                mutable_unknown_fields<std::__cxx11::string>
                          (&(this->super_MessageLite)._internal_metadata_);
      ctx_local = (ParseContext *)
                  google::protobuf::internal::UnknownFieldParse
                            (tag_00,unknown,(char *)ctx_local,pPStack_20);
      goto joined_r0x0035b4b5;
    }
    if ((local_24 & 0xff) != 0x10) goto LAB_0035b44e;
    uVar3 = google::protobuf::internal::ReadVarint64((char **)&ctx_local);
    this->windowsize_ = uVar3;
    if (ctx_local == (ParseContext *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* SlidingWindowsLayerParams::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // int64 axis = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 8)) {
          axis_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // uint64 windowSize = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 16)) {
          windowsize_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // uint64 step = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 24)) {
          step_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}